

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

Abc_Des_t * Abc_DesDup(Abc_Des_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Abc_Des_t *p_00;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  long lVar10;
  
  p_00 = Abc_DesCreate(p->pName);
  pVVar3 = p->vModules;
  if (0 < pVVar3->nSize) {
    lVar10 = 0;
    do {
      pNtk = Abc_NtkDup((Abc_Ntk_t *)pVVar3->pArray[lVar10]);
      Abc_DesAddModel(p_00,pNtk);
      lVar10 = lVar10 + 1;
      pVVar3 = p->vModules;
    } while (lVar10 < pVVar3->nSize);
  }
  pVVar3 = p->vTops;
  if (0 < pVVar3->nSize) {
    lVar10 = 0;
    do {
      pVVar1 = p_00->vTops;
      pvVar2 = *(void **)((long)pVVar3->pArray[lVar10] + 0x160);
      uVar8 = pVVar1->nCap;
      if (pVVar1->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar4;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar8 * 2;
          if (iVar7 <= (int)uVar8) goto LAB_00856e49;
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar1->pArray,(ulong)uVar8 << 4);
          }
          pVVar1->pArray = ppvVar4;
        }
        pVVar1->nCap = iVar7;
      }
LAB_00856e49:
      iVar7 = pVVar1->nSize;
      pVVar1->nSize = iVar7 + 1;
      pVVar1->pArray[iVar7] = pvVar2;
      lVar10 = lVar10 + 1;
      pVVar3 = p->vTops;
    } while (lVar10 < pVVar3->nSize);
  }
  lVar10 = (long)p->vModules->nSize;
  if (0 < lVar10) {
    ppvVar4 = p->vModules->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar4[lVar5];
      lVar6 = *(long *)((long)pvVar2 + 0xb8);
      if (lVar6 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined8 *)(lVar6 + 0x160);
      }
      *(undefined8 *)(*(long *)((long)pvVar2 + 0x160) + 0xb8) = uVar9;
      lVar5 = lVar5 + 1;
    } while (lVar10 != lVar5);
  }
  pVVar3 = p->vModules;
  if (0 < pVVar3->nSize) {
    lVar10 = 0;
    do {
      pvVar2 = pVVar3->pArray[lVar10];
      lVar5 = *(long *)((long)pvVar2 + 0x50);
      if (0 < *(int *)(lVar5 + 4)) {
        lVar6 = 0;
        do {
          lVar5 = *(long *)(*(long *)(lVar5 + 8) + lVar6 * 8);
          uVar8 = *(uint *)(lVar5 + 0x14) & 0xf;
          if (uVar8 == 9) {
            *(undefined8 *)(*(long *)(lVar5 + 0x40) + 0x38) =
                 *(undefined8 *)(*(long *)(lVar5 + 0x38) + 0x160);
          }
          else if (uVar8 == 10) {
            __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
          }
          lVar6 = lVar6 + 1;
          lVar5 = *(long *)((long)pvVar2 + 0x50);
        } while (lVar6 < *(int *)(lVar5 + 4));
      }
      lVar10 = lVar10 + 1;
      pVVar3 = p->vModules;
    } while (lVar10 < pVVar3->nSize);
  }
  return p_00;
}

Assistant:

Abc_Des_t * Abc_DesDup( Abc_Des_t * p )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pTemp;
    Abc_Obj_t * pObj;
    int i, k;
    pNew = Abc_DesCreate( p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_DesAddModel( pNew, Abc_NtkDup(pTemp) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vTops, pTemp, i )
        Vec_PtrPush( pNew->vTops, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    return pNew;
}